

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferMAXSizeValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferMAXSizeValidation::initTest(TextureBufferMAXSizeValidation *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  long lVar7;
  char *__s;
  TestError *this_01;
  char *local_68;
  char *csCode;
  string local_58 [8];
  string csSource;
  GLuint i;
  GLubyte *buf;
  Functions *gl;
  TextureBufferMAXSizeValidation *this_local;
  long lVar6;
  
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
               ,0x46);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TEXTURE_BUFFER_SIZE,
             &this->m_max_tex_buffer_size);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error getting gl parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x4e);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_tbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x52);
  (**(code **)(lVar6 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x54);
  (**(code **)(lVar6 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
             (long)this->m_max_tex_buffer_size,0,0x88e8);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x56);
  lVar7 = (**(code **)(lVar6 + 0xd00))
                    ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
                     (long)this->m_max_tex_buffer_size,2);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x5c);
  for (csSource.field_2._12_4_ = 0;
      (uint)csSource.field_2._12_4_ < (uint)this->m_max_tex_buffer_size;
      csSource.field_2._12_4_ = csSource.field_2._12_4_ + 1) {
    *(char *)(lVar7 + (ulong)(uint)csSource.field_2._12_4_) = (char)csSource.field_2._12_4_;
  }
  (**(code **)(lVar6 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error ummapping buffer object\'s data store from client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,100);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_tbo_tex_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x68);
  (**(code **)(lVar6 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error asetting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6a);
  (**(code **)(lVar6 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6c);
  (**(code **)(lVar6 + 0x12f8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8232,this->m_tbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object as data store for texture buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6f);
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x73);
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar4;
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x76);
  __s = getComputeShaderCode(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,__s,(allocator<char> *)((long)&csCode + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&csCode + 7));
  local_68 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_68,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create program from valid compute shader object!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
               ,0x7d);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_ssbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x82);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_ssbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding  buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x84);
  (**(code **)(lVar6 + 0x150))(0x8892,0xc,0,0x88ea);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x86);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void TextureBufferMAXSizeValidation::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Query for the value of max texture buffer size */
	gl.getIntegerv(m_glExtTokens.MAX_TEXTURE_BUFFER_SIZE, &m_max_tex_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting gl parameter value!");

	/* Create texture buffer object*/
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_max_tex_buffer_size * sizeof(glw::GLubyte), DE_NULL, GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	glw::GLubyte* buf = 0;

	buf = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, 0,
										   m_max_tex_buffer_size * sizeof(glw::GLubyte), GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client's address space!");

	for (glw::GLuint i = 0; i < (glw::GLuint)m_max_tex_buffer_size; ++i)
	{
		buf[i] = (glw::GLubyte)(i % 256);
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer object's data store from client's address space!");

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error asetting active texture unit!");
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R8UI, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object as data store for texture buffer!");

	/* Create program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create program from valid compute shader object!");
	}

	/* Create Shader Storage Buffer Object */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
	gl.bufferData(GL_ARRAY_BUFFER, m_n_vec_components * sizeof(glw::GLuint), 0, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
}